

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::QueryMemoryBySysconf(SystemInformationImplementation *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = sysconf(0x55);
  uVar3 = sysconf(0x1e);
  bVar4 = false;
  if (-1 < (long)(uVar2 | uVar3)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100000)) / auVar1,0);
    this->TotalPhysicalMemory = uVar2 / uVar3;
    uVar2 = sysconf(0x56);
    bVar4 = false;
    if (-1 < (long)uVar2) {
      this->AvailablePhysicalMemory = uVar2 / uVar3;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool SystemInformationImplementation::QueryMemoryBySysconf()
{
#if defined(_SC_PHYS_PAGES) && defined(_SC_PAGESIZE)
  // Assume the mmap() granularity as returned by _SC_PAGESIZE is also
  // the system page size. The only known system where this isn't true
  // is Cygwin.
  long p = sysconf(_SC_PHYS_PAGES);
  long m = sysconf(_SC_PAGESIZE);

  if (p < 0 || m < 0)
    {
    return false;
    }

  // assume pagesize is a power of 2 and smaller 1 MiB
  size_t pagediv = (1024 * 1024 / m);

  this->TotalPhysicalMemory = p;
  this->TotalPhysicalMemory /= pagediv;

#if defined(_SC_AVPHYS_PAGES)
  p = sysconf(_SC_AVPHYS_PAGES);
  if (p < 0)
    {
    return false;
    }

  this->AvailablePhysicalMemory = p;
  this->AvailablePhysicalMemory /= pagediv;
#endif

  return true;
#else
  return false;
#endif
}